

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrefcnt.cpp
# Opt level: O3

void __thiscall CVmWeakRefable::~CVmWeakRefable(CVmWeakRefable *this)

{
  OS_Counter *pOVar1;
  OS_Mutex *pOVar2;
  CVmWeakRef *pCVar3;
  
  (this->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__CVmWeakRefable_003255d8;
  pOVar2 = this->mu;
  LOCK();
  pOVar1 = &(pOVar2->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pOVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
  }
  pCVar3 = this->weakref;
  if (pCVar3 != (CVmWeakRef *)0x0) {
    LOCK();
    pOVar1 = &(pCVar3->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(pCVar3->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
      return;
    }
  }
  return;
}

Assistant:

CVmWeakRefable::~CVmWeakRefable()
{
    /* done with our mutex */
    mu->release_ref();

    /* if we have a weak ref object, release it */
    if (weakref != 0)
        weakref->release_ref();
}